

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O0

void __thiscall TcpConnection::add_task(TcpConnection *this)

{
  int fd;
  EventLoop *pEVar1;
  bool bVar2;
  log_level lVar3;
  Logger *pLVar4;
  enable_shared_from_this<TcpConnection> local_80;
  EventCallback local_70;
  enable_shared_from_this<TcpConnection> local_40;
  Task local_30;
  TcpConnection *local_10;
  TcpConnection *this_local;
  
  local_10 = this;
  pLVar4 = Logger::get_instance();
  bVar2 = Logger::is_inited(pLVar4);
  if ((!bVar2) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","add_task",0x1b);
  }
  lVar3 = Logger::get_log_level();
  if (1 < (int)lVar3) {
    pLVar4 = Logger::get_instance();
    Logger::write_log(pLVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp"
                      ,"add_task",0x1b,LOG_LEVEL_INFO,
                      "tcp connection add connected task to poller, conn fd is %d\n",this->tc_fd);
    pLVar4 = Logger::get_instance();
    Logger::flush(pLVar4);
  }
  pEVar1 = this->tc_loop;
  std::enable_shared_from_this<TcpConnection>::shared_from_this(&local_40);
  std::function<void()>::function<TcpConnection::add_task()::__0,void>
            ((function<void()> *)&local_30,(anon_class_16_1_31423c98 *)&local_40);
  EventLoop::add_task(pEVar1,&local_30);
  std::function<void_()>::~function(&local_30);
  add_task()::$_0::~__0((__0 *)&local_40);
  pLVar4 = Logger::get_instance();
  bVar2 = Logger::is_inited(pLVar4);
  if ((!bVar2) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","add_task",0x1d);
  }
  lVar3 = Logger::get_log_level();
  if (1 < (int)lVar3) {
    pLVar4 = Logger::get_instance();
    Logger::write_log(pLVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp"
                      ,"add_task",0x1d,LOG_LEVEL_INFO,
                      "tcp connection add do read to poller, conn fd is %d\n",this->tc_fd);
    pLVar4 = Logger::get_instance();
    Logger::flush(pLVar4);
  }
  pEVar1 = this->tc_loop;
  fd = this->tc_fd;
  std::enable_shared_from_this<TcpConnection>::shared_from_this(&local_80);
  std::function<void()>::function<TcpConnection::add_task()::__1,void>
            ((function<void()> *)&local_70,(anon_class_16_1_31423c98 *)&local_80);
  EventLoop::add_to_poller(pEVar1,fd,1,&local_70);
  std::function<void_()>::~function(&local_70);
  add_task()::$_1::~__1((__1 *)&local_80);
  return;
}

Assistant:

void TcpConnection::add_task() {
LOG_INFO("tcp connection add connected task to poller, conn fd is %d\n", tc_fd);
    tc_loop->add_task([shared_this=shared_from_this()](){ shared_this->connected(); });
LOG_INFO("tcp connection add do read to poller, conn fd is %d\n", tc_fd);
    tc_loop->add_to_poller(tc_fd, EPOLLIN, [shared_this=shared_from_this()](){ shared_this->do_read(); });
}